

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

char * append_str(char *zText,int n,int p1,int p2)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  char *__dest;
  char zInt [40];
  char local_58 [40];
  
  if (zText == (char *)0x0) {
    append_str::used = 0;
    pcVar6 = append_str::z;
  }
  else {
    sVar2 = (size_t)(uint)n;
    if (n < 1) {
      if ((n < 0) && (append_str::used = append_str::used + n, append_str::used < 0)) {
        __assert_fail("used>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                      ,0xcea,"char *append_str(const char *, int, int, int)");
      }
      sVar2 = strlen(zText);
    }
    iVar7 = append_str::used;
    iVar1 = (int)sVar2 + append_str::used;
    if (append_str::alloced <= iVar1 + 0x50) {
      append_str::alloced = iVar1 + 0x118;
      append_str::z = (char *)realloc(append_str::z,(long)append_str::alloced);
    }
    if (append_str::z != (char *)0x0) {
      pcVar6 = append_str::z;
      do {
        iVar1 = (int)sVar2;
        iVar5 = 0;
        lVar4 = 0;
        while( true ) {
          if (iVar1 + iVar5 < 1) {
            pcVar6[lVar4 + iVar7] = '\0';
            return pcVar6;
          }
          iVar3 = (int)lVar4;
          if (((iVar1 + -1 != iVar3) && (zText[lVar4] == '%')) && (zText[lVar4 + 1] == 'd')) break;
          append_str::used = iVar7 + 1 + iVar3;
          pcVar6[lVar4 + iVar7] = zText[lVar4];
          lVar4 = lVar4 + 1;
          iVar5 = iVar5 + -1;
        }
        sprintf(local_58,"%d",(ulong)(uint)p1);
        iVar7 = append_str::used;
        pcVar6 = append_str::z;
        __dest = append_str::z + append_str::used;
        strcpy(__dest,local_58);
        sVar2 = strlen(__dest);
        iVar7 = (int)sVar2 + iVar7;
        zText = zText + lVar4 + 2;
        sVar2 = (size_t)((iVar1 - iVar3) - 2);
        p1 = p2;
        append_str::used = iVar7;
      } while( true );
    }
    pcVar6 = append_str::empty;
  }
  return pcVar6;
}

Assistant:

PRIVATE char *append_str(const char *zText, int n, int p1, int p2){
  static char empty[1] = { 0 };
  static char *z = 0;
  static int alloced = 0;
  static int used = 0;
  int c;
  char zInt[40];
  if( zText==0 ){
    used = 0;
    return z;
  }
  if( n<=0 ){
    if( n<0 ){
      used += n;
      assert( used>=0 );
    }
    n = lemonStrlen(zText);
  }
  if( (int) (n+sizeof(zInt)*2+used) >= alloced ){
    alloced = n + sizeof(zInt)*2 + used + 200;
    z = (char *) realloc(z,  alloced);
  }
  if( z==0 ) return empty;
  while( n-- > 0 ){
    c = *(zText++);
    if( c=='%' && n>0 && zText[0]=='d' ){
      sprintf(zInt, "%d", p1);
      p1 = p2;
      strcpy(&z[used], zInt);
      used += lemonStrlen(&z[used]);
      zText++;
      n--;
    }else{
      z[used++] = c;
    }
  }
  z[used] = 0;
  return z;
}